

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cvc.c
# Opt level: O0

err_t cmdCVCsCheck(octet *certs,size_t certs_len)

{
  blob_t pvVar1;
  long in_RSI;
  size_t len;
  btok_cvc_t *cvc;
  void *stack;
  err_t code;
  size_t in_stack_00000038;
  octet *in_stack_00000040;
  size_t in_stack_00000048;
  octet *in_stack_00000050;
  btok_cvc_t *in_stack_00000058;
  octet *in_stack_ffffffffffffffc8;
  err_t local_1c;
  long local_18;
  err_t local_4;
  
  pvVar1 = blobCreate((size_t)in_stack_ffffffffffffffc8);
  local_1c = 0x6e;
  if (pvVar1 != (blob_t)0x0) {
    local_1c = 0;
  }
  local_18 = in_RSI;
  local_4 = local_1c;
  if (local_1c == 0) {
    for (; local_18 != 0; local_18 = local_18 - (long)in_stack_ffffffffffffffc8) {
      in_stack_ffffffffffffffc8 = (octet *)btokCVCLen(in_stack_ffffffffffffffc8,0x10498b);
      if (in_stack_ffffffffffffffc8 == (octet *)0xffffffffffffffff) {
        local_1c = 0x204;
      }
      else {
        local_1c = btokCVCUnwrap(in_stack_00000058,in_stack_00000050,in_stack_00000048,
                                 in_stack_00000040,in_stack_00000038);
      }
      if (local_1c != 0) {
        blobClose((blob_t)0x1049d0);
        return local_1c;
      }
    }
    blobClose((blob_t)0x104a08);
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

err_t cmdCVCsCheck(const octet* certs, size_t certs_len)
{
	err_t code;
	void* stack;
	btok_cvc_t* cvc;
	// pre
	ASSERT(memIsValid(certs, certs_len));
	// выделить и разметить память
	code = cmdBlobCreate(stack, sizeof(btok_cvc_t));
	ERR_CALL_CHECK(code);
	cvc = (btok_cvc_t*)stack;
	// цикл по сертификатам
	while (certs_len)
	{
		// разобрать сертификат
		size_t len = btokCVCLen(certs, certs_len);
		if (len == SIZE_MAX)
			code = ERR_BAD_CERTRING;
		else
			code = btokCVCUnwrap(cvc, certs, len, 0, 0);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// к следующему
		certs += len, certs_len -= len;
	}
	// завершить
	cmdBlobClose(stack);
	return code;
}